

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int handle_max_stream_data_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *end;
  _func_void_void_ptr_char_ptr_varargs *p_Var1;
  uint64_t stream_id;
  quicly_stream_t *stream;
  int iVar2;
  
  end = state->end;
  stream_id = ptls_decode_quicint(&state->src,end);
  if (stream_id == 0xffffffffffffffff) {
    iVar2 = 0x20007;
  }
  else {
    state = (st_quicly_handle_payload_state_t *)ptls_decode_quicint(&state->src,end);
    iVar2 = 0x20007;
    if (state != (st_quicly_handle_payload_state_t *)0xffffffffffffffff) {
      iVar2 = 0;
    }
  }
  if (iVar2 == 0) {
    if (quicly_trace_fp != (FILE *)0x0) {
      handle_max_stream_data_frame_cold_1();
    }
    p_Var1 = (conn->super).tracer.cb;
    if (p_Var1 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
      (*p_Var1)((conn->super).tracer.ctx,
                "{\"type\":\"max-stream-data-receive\", \"time\":%lld, \"stream-id\":%lld, \"maximum\":%llu}\n"
                ,(conn->stash).now,stream_id,state);
    }
    if (((stream_id & 0x8000000000000002) != 2) ||
       (iVar2 = 0x20007,
       (((uint)(conn->super).local.bidi.next_stream_id ^ (uint)stream_id) & 1) == 0)) {
      stream = quicly_get_stream(conn,stream_id);
      iVar2 = 0;
      if ((stream != (quicly_stream_t *)0x0) &&
         ((st_quicly_handle_payload_state_t *)(stream->_send_aux).max_stream_data <= state)) {
        (stream->_send_aux).max_stream_data = (uint64_t)state;
        (stream->_send_aux).blocked = QUICLY_SENDER_STATE_NONE;
        iVar2 = 0;
        if ((stream->_send_aux).reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
          resched_stream_data(stream);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int handle_max_stream_data_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_max_stream_data_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_max_stream_data_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(MAX_STREAM_DATA_RECEIVE, conn, conn->stash.now, frame.stream_id, frame.max_stream_data);

    if (!quicly_stream_has_send_side(quicly_is_client(conn), frame.stream_id))
        return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;

    if ((stream = quicly_get_stream(conn, frame.stream_id)) == NULL)
        return 0;

    if (frame.max_stream_data < stream->_send_aux.max_stream_data)
        return 0;
    stream->_send_aux.max_stream_data = frame.max_stream_data;
    stream->_send_aux.blocked = QUICLY_SENDER_STATE_NONE;

    if (stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE)
        resched_stream_data(stream);

    return 0;
}